

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall
TestOutput::printErrorInFileOnLineFormattedForWorkingEnvironment
          (TestOutput *this,SimpleString *file,size_t lineNumber)

{
  WorkingEnvironment WVar1;
  undefined8 in_RDX;
  long *in_RDI;
  SimpleString *in_stack_ffffffffffffff98;
  SimpleString *pSVar2;
  SimpleString *in_stack_ffffffffffffffa0;
  SimpleString local_48 [2];
  SimpleString local_28;
  undefined8 local_18;
  
  local_18 = in_RDX;
  WVar1 = getWorkingEnvironment();
  if (WVar1 == visualStudio) {
    pSVar2 = &local_28;
    SimpleString::SimpleString(pSVar2,in_stack_ffffffffffffff98);
    (**(code **)(*in_RDI + 0xa8))(in_RDI,pSVar2,local_18);
    SimpleString::~SimpleString((SimpleString *)0x182367);
  }
  else {
    pSVar2 = local_48;
    SimpleString::SimpleString(in_stack_ffffffffffffffa0,pSVar2);
    (**(code **)(*in_RDI + 0xa0))(in_RDI,pSVar2,local_18);
    SimpleString::~SimpleString((SimpleString *)0x1823bc);
  }
  return;
}

Assistant:

void TestOutput::printErrorInFileOnLineFormattedForWorkingEnvironment(SimpleString file, size_t lineNumber)
{
    if (TestOutput::getWorkingEnvironment() == TestOutput::visualStudio)
        printVisualStudioErrorInFileOnLine(file, lineNumber);
    else
        printEclipseErrorInFileOnLine(file, lineNumber);
}